

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_smpl.c
# Opt level: O0

int ossl_ec_GFp_simple_point_init(EC_POINT *point)

{
  BIGNUM *pBVar1;
  long in_RDI;
  undefined4 local_4;
  
  pBVar1 = BN_new();
  *(BIGNUM **)(in_RDI + 0x10) = pBVar1;
  pBVar1 = BN_new();
  *(BIGNUM **)(in_RDI + 0x18) = pBVar1;
  pBVar1 = BN_new();
  *(BIGNUM **)(in_RDI + 0x20) = pBVar1;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  if (((*(long *)(in_RDI + 0x10) == 0) || (*(long *)(in_RDI + 0x18) == 0)) ||
     (*(long *)(in_RDI + 0x20) == 0)) {
    BN_free(*(BIGNUM **)(in_RDI + 0x10));
    BN_free(*(BIGNUM **)(in_RDI + 0x18));
    BN_free(*(BIGNUM **)(in_RDI + 0x20));
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int ossl_ec_GFp_simple_point_init(EC_POINT *point)
{
    point->X = BN_new();
    point->Y = BN_new();
    point->Z = BN_new();
    point->Z_is_one = 0;

    if (point->X == NULL || point->Y == NULL || point->Z == NULL) {
        BN_free(point->X);
        BN_free(point->Y);
        BN_free(point->Z);
        return 0;
    }
    return 1;
}